

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_glows.cxx
# Opt level: O3

void __thiscall read_glow_v13::operator()(read_glow_v13 *this,glow_data **_glow,xr_reader *r)

{
  uint16_t uVar1;
  float *pfVar2;
  glow_data *pgVar3;
  
  pgVar3 = (glow_data *)operator_new(0x14);
  *_glow = pgVar3;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (pgVar3->position).field_0.field_0.x = *pfVar2;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 2);
  (pgVar3->position).field_0.field_0.y = pfVar2[1];
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 3);
  (pgVar3->position).field_0.field_0.z = pfVar2[2];
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 4);
  pgVar3->radius = pfVar2[3];
  (r->field_2).m_p = (uint8_t *)((long)pfVar2 + 0x12);
  uVar1 = *(uint16_t *)(pfVar2 + 4);
  pgVar3->shader_id = uVar1;
  pgVar3->texture_id = uVar1;
  return;
}

Assistant:

void operator()(glow_data*& _glow, xr_reader& r) const {
	glow_data* glow = new glow_data;
	_glow = glow;
	r.r_fvector3(glow->position);
	glow->radius = r.r_float();
	glow->texture_id = glow->shader_id = r.r_u16();
}